

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

void INT_EVset_store_limit(CManager_conflict cm,EVstone stone_num,EVaction action_num,int new_limit)

{
  int iVar1;
  stone_type p_Var2;
  undefined4 in_ECX;
  int in_EDX;
  long in_RDI;
  event_item *item;
  proto_action *p;
  stone_type stone;
  event_path_data evp;
  CManager_conflict in_stack_000000b0;
  event_path_data in_stack_ffffffffffffffc8;
  CManager_conflict cm_00;
  CManager_conflict cm_01;
  
  cm_01 = *(CManager_conflict *)(in_RDI + 0x118);
  p_Var2 = stone_struct(in_stack_ffffffffffffffc8,0);
  if (p_Var2 != (stone_type)0x0) {
    cm_00 = (CManager_conflict)(p_Var2->proto_actions + in_EDX);
    *(undefined4 *)((long)&cm_00->control_list + 4) = in_ECX;
    if (*(int *)((long)&cm_00->control_list + 4) != -1) {
      while ((*(int *)((long)&cm_00->control_list + 4) < cm_00->in_format_count &&
             (in_stack_ffffffffffffffc8 =
                   (event_path_data)
                   storage_queue_dequeue(cm_00,(storage_queue_ptr)in_stack_ffffffffffffffc8),
             in_stack_ffffffffffffffc8 != (event_path_data)0x0))) {
        cm_00->in_format_count = cm_00->in_format_count + -1;
        internal_path_submit(cm_01,(int)((ulong)p_Var2 >> 0x20),(event_item *)cm_00);
        do {
          iVar1 = process_local_actions(in_stack_000000b0);
        } while (iVar1 != 0);
        return_event((event_path_data)stone,(event_item *)p);
      }
    }
  }
  return;
}

Assistant:

void
INT_EVset_store_limit(CManager cm, EVstone stone_num, EVaction action_num, int new_limit)
{
    event_path_data evp = cm->evp;
    stone_type stone;
    proto_action *p;

    stone = stone_struct(evp, stone_num);
    if (!stone) return;

    p = &stone->proto_actions[action_num];
    p->o.store.max_stored = new_limit;
    if (p->o.store.max_stored != -1) {
        while (p->o.store.num_stored > p->o.store.max_stored) {
            event_item *item;
            item = storage_queue_dequeue(cm, &p->o.store.queue);
            if (!item)
                break;
            p->o.store.num_stored--;
            internal_path_submit(cm, p->o.store.target_stone_id, item);
            while (process_local_actions(cm));
            return_event(evp, item);
        }
    }
}